

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O2

char * fread_word(FILE *fp)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  string_view fmt;
  
  do {
    uVar1 = getc((FILE *)fp);
    iVar2 = isspace((int)(char)uVar1);
  } while (iVar2 != 0);
  if ((uVar1 << 0x18 == 0x27000000) || (uVar1 << 0x18 == 0x22000000)) {
    uVar3 = uVar1 & 0x27;
    pcVar4 = fread_word::word;
  }
  else {
    uVar3 = 0x20;
    pcVar4 = fread_word::word + 1;
    fread_word::word[0] = (char)uVar1;
  }
  do {
    if (fread_word::word + 0x11ff < pcVar4) {
      fmt._M_str = "Fread_word: word too long [{}].";
      fmt._M_len = 0x1f;
      CLogger::Error<char(&)[4608]>((CLogger *)&wear_locations,fmt,&fread_word::word);
      exit(1);
    }
    iVar2 = getc((FILE *)fp);
    *pcVar4 = (char)iVar2;
    uVar1 = (uint)(char)iVar2;
    if (uVar3 == 0x20) {
      iVar2 = isspace(uVar1);
      if (iVar2 != 0) {
        ungetc(uVar1,(FILE *)fp);
LAB_0013f39e:
        *pcVar4 = '\0';
        return fread_word::word;
      }
    }
    else if (uVar1 == uVar3) goto LAB_0013f39e;
    pcVar4 = pcVar4 + 1;
  } while( true );
}

Assistant:

char *fread_word(FILE *fp)
{
	static char word[MAX_INPUT_LENGTH];
	char *pword;
	char cEnd;

	do
	{
		cEnd = getc(fp);
	} while (isspace(cEnd));

	if (cEnd == '\'' || cEnd == '"')
	{
		pword = word;
	}
	else
	{
		word[0] = cEnd;
		pword = word + 1;
		cEnd = ' ';
	}

	for (; pword < word + MAX_INPUT_LENGTH; pword++)
	{
		*pword = getc(fp);
		if (cEnd == ' ' ? isspace(*pword) : *pword == cEnd)
		{
			if (cEnd == ' ')
				ungetc(*pword, fp);

			*pword = '\0';
			return word;
		}
	}

	RS.Logger.Error("Fread_word: word too long [{}].", word);
	exit(1);
	return nullptr;
}